

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

unsigned_long
xmlHashComputeQKey(xmlHashTablePtr table,xmlChar *prefix,xmlChar *name,xmlChar *prefix2,
                  xmlChar *name2,xmlChar *prefix3,xmlChar *name3)

{
  byte bVar1;
  ulong uStack_40;
  char ch;
  unsigned_long value;
  xmlChar *prefix3_local;
  xmlChar *name2_local;
  xmlChar *prefix2_local;
  xmlChar *name_local;
  xmlChar *prefix_local;
  xmlHashTablePtr table_local;
  
  if (prefix == (xmlChar *)0x0) {
    bVar1 = *name;
  }
  else {
    bVar1 = *prefix;
  }
  uStack_40 = (long)(int)((uint)bVar1 * 0x1e) + (long)table->random_seed;
  name_local = prefix;
  if (prefix != (xmlChar *)0x0) {
    while( true ) {
      if (*name_local == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)(char)*name_local;
      name_local = name_local + 1;
    }
    uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + 0x3a;
  }
  prefix2_local = name;
  if (name != (xmlChar *)0x0) {
    while( true ) {
      if (*prefix2_local == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)(char)*prefix2_local;
      prefix2_local = prefix2_local + 1;
    }
  }
  uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3);
  name2_local = prefix2;
  if (prefix2 != (xmlChar *)0x0) {
    while( true ) {
      if (*name2_local == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)(char)*name2_local;
      name2_local = name2_local + 1;
    }
    uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + 0x3a;
  }
  prefix3_local = name2;
  if (name2 != (xmlChar *)0x0) {
    while( true ) {
      if (*prefix3_local == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)(char)*prefix3_local;
      prefix3_local = prefix3_local + 1;
    }
  }
  uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3);
  value = (unsigned_long)prefix3;
  if (prefix3 != (xmlChar *)0x0) {
    while( true ) {
      if (*(char *)value == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)*(char *)value;
      value = value + 1;
    }
    uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + 0x3a;
  }
  if (name3 != (xmlChar *)0x0) {
    while( true ) {
      if (*name3 == '\0') break;
      uStack_40 = uStack_40 ^ uStack_40 * 0x20 + (uStack_40 >> 3) + (long)(char)*name3;
      name3 = name3 + 1;
    }
  }
  return uStack_40 % (ulong)(long)table->size;
}

Assistant:

static unsigned long
xmlHashComputeQKey(xmlHashTablePtr table,
		   const xmlChar *prefix, const xmlChar *name,
		   const xmlChar *prefix2, const xmlChar *name2,
		   const xmlChar *prefix3, const xmlChar *name3) {
    unsigned long value = 0L;
    char ch;

#ifdef HASH_RANDOMIZATION
    value = table->random_seed;
#endif
    if (prefix != NULL)
	value += 30 * (*prefix);
    else
	value += 30 * (*name);

    if (prefix != NULL) {
	while ((ch = *prefix++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
	value = value ^ ((value << 5) + (value >> 3) + (unsigned long)':');
    }
    if (name != NULL) {
	while ((ch = *name++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (prefix2 != NULL) {
	while ((ch = *prefix2++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
	value = value ^ ((value << 5) + (value >> 3) + (unsigned long)':');
    }
    if (name2 != NULL) {
	while ((ch = *name2++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    value = value ^ ((value << 5) + (value >> 3));
    if (prefix3 != NULL) {
	while ((ch = *prefix3++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
	value = value ^ ((value << 5) + (value >> 3) + (unsigned long)':');
    }
    if (name3 != NULL) {
	while ((ch = *name3++) != 0) {
	    value = value ^ ((value << 5) + (value >> 3) + (unsigned long)ch);
	}
    }
    return (value % table->size);
}